

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O2

void __thiscall
cmArchiveWrite::cmArchiveWrite
          (cmArchiveWrite *this,ostream *os,Compress c,string *format,int compressionLevel,
          int numThreads)

{
  string *this_00;
  uint uVar1;
  int iVar2;
  archive *paVar3;
  uint uVar4;
  string *this_01;
  string *this_02;
  string archiveFilterName;
  string source_date_epoch;
  string local_90;
  string sNumThreads;
  string local_50;
  
  this_01 = &archiveFilterName;
  this_02 = &archiveFilterName;
  this->Stream = os;
  paVar3 = archive_write_new();
  this->Archive = paVar3;
  paVar3 = archive_read_disk_new();
  this->Disk = paVar3;
  this->Verbose = false;
  std::__cxx11::string::string((string *)&this->Format,(string *)format);
  (this->Error)._M_dataplus._M_p = (pointer)&(this->Error).field_2;
  (this->Error)._M_string_length = 0;
  (this->Error).field_2._M_local_buf[0] = '\0';
  (this->MTime)._M_dataplus._M_p = (pointer)&(this->MTime).field_2;
  (this->MTime)._M_string_length = 0;
  (this->MTime).field_2._M_local_buf[0] = '\0';
  (this->Uid).IsValueSet = false;
  (this->Gid).IsValueSet = false;
  (this->Uname)._M_dataplus._M_p = (pointer)&(this->Uname).field_2;
  (this->Uname)._M_string_length = 0;
  (this->Uname).field_2._M_local_buf[0] = '\0';
  (this->Gname)._M_dataplus._M_p = (pointer)&(this->Gname).field_2;
  (this->Gname)._M_string_length = 0;
  (this->Gname).field_2._M_local_buf[0] = '\0';
  (this->Permissions).IsValueSet = false;
  (this->PermissionsMask).IsValueSet = false;
  if (numThreads < 1) {
    uVar4 = 0x7fffffff;
    if (numThreads != 0) {
      uVar4 = -numThreads;
    }
    uVar1 = std::thread::hardware_concurrency();
    numThreads = uVar4;
    if (uVar1 <= uVar4) {
      numThreads = uVar1;
    }
    if ((int)uVar1 < 1) {
      numThreads = 1;
    }
  }
  this_00 = &this->Error;
  std::__cxx11::to_string(&sNumThreads,numThreads);
  switch(c) {
  case CompressNone:
    iVar2 = archive_write_add_filter_none(this->Archive);
    if (iVar2 == 0) goto switchD_0011ff60_default;
    cm_archive_error_string_abi_cxx11_(&archiveFilterName,this->Archive);
    cmStrCat<char_const(&)[32],std::__cxx11::string>
              (&source_date_epoch,(char (*) [32])"archive_write_add_filter_none: ",
               &archiveFilterName);
    break;
  case CompressCompress:
    iVar2 = archive_write_add_filter_compress(this->Archive);
    if (iVar2 == 0) goto switchD_0011ff60_default;
    cm_archive_error_string_abi_cxx11_(&archiveFilterName,this->Archive);
    cmStrCat<char_const(&)[36],std::__cxx11::string>
              (&source_date_epoch,(char (*) [36])"archive_write_add_filter_compress: ",
               &archiveFilterName);
    break;
  case CompressGZip:
    iVar2 = archive_write_add_filter_gzip(this->Archive);
    if (iVar2 != 0) {
      cm_archive_error_string_abi_cxx11_(&archiveFilterName,this->Archive);
      cmStrCat<char_const(&)[32],std::__cxx11::string>
                (&source_date_epoch,(char (*) [32])"archive_write_add_filter_gzip: ",
                 &archiveFilterName);
      break;
    }
    source_date_epoch._M_dataplus._M_p = (pointer)&source_date_epoch.field_2;
    source_date_epoch._M_string_length = 0;
    source_date_epoch.field_2._M_local_buf[0] = '\0';
    cmsys::SystemTools::GetEnv("SOURCE_DATE_EPOCH",&source_date_epoch);
    if ((source_date_epoch._M_string_length == 0) ||
       (iVar2 = archive_write_set_filter_option(this->Archive,"gzip","timestamp",(char *)0x0),
       iVar2 == 0)) {
      std::__cxx11::string::~string((string *)&source_date_epoch);
      goto switchD_0011ff60_default;
    }
    cm_archive_error_string_abi_cxx11_(&local_90,this->Archive);
    cmStrCat<char_const(&)[34],std::__cxx11::string>
              (&archiveFilterName,(char (*) [34])"archive_write_set_filter_option: ",&local_90);
    std::__cxx11::string::operator=((string *)this_00,(string *)&archiveFilterName);
    std::__cxx11::string::~string((string *)&archiveFilterName);
    this_01 = &local_90;
LAB_001202c3:
    std::__cxx11::string::~string((string *)this_01);
    this_02 = &source_date_epoch;
    goto LAB_00120391;
  case CompressBZip2:
    iVar2 = archive_write_add_filter_bzip2(this->Archive);
    if (iVar2 == 0) goto switchD_0011ff60_default;
    cm_archive_error_string_abi_cxx11_(&archiveFilterName,this->Archive);
    cmStrCat<char_const(&)[33],std::__cxx11::string>
              (&source_date_epoch,(char (*) [33])"archive_write_add_filter_bzip2: ",
               &archiveFilterName);
    break;
  case CompressLZMA:
    iVar2 = archive_write_add_filter_lzma(this->Archive);
    if (iVar2 == 0) goto switchD_0011ff60_default;
    cm_archive_error_string_abi_cxx11_(&archiveFilterName,this->Archive);
    cmStrCat<char_const(&)[32],std::__cxx11::string>
              (&source_date_epoch,(char (*) [32])"archive_write_add_filter_lzma: ",
               &archiveFilterName);
    break;
  case CompressXZ:
    iVar2 = archive_write_add_filter_xz(this->Archive);
    if (iVar2 == 0) {
      iVar2 = archive_write_set_filter_option
                        (this->Archive,"xz","threads",sNumThreads._M_dataplus._M_p);
      if (iVar2 == 0) goto switchD_0011ff60_default;
      cm_archive_error_string_abi_cxx11_(&archiveFilterName,this->Archive);
      cmStrCat<char_const(&)[32],std::__cxx11::string>
                (&source_date_epoch,(char (*) [32])"archive_compressor_xz_options: ",
                 &archiveFilterName);
    }
    else {
      cm_archive_error_string_abi_cxx11_(&archiveFilterName,this->Archive);
      cmStrCat<char_const(&)[30],std::__cxx11::string>
                (&source_date_epoch,(char (*) [30])"archive_write_add_filter_xz: ",
                 &archiveFilterName);
    }
    break;
  case CompressZstd:
    iVar2 = archive_write_add_filter_zstd(this->Archive);
    if (iVar2 == 0) {
      iVar2 = archive_write_set_filter_option
                        (this->Archive,"zstd","threads",sNumThreads._M_dataplus._M_p);
      if (iVar2 == 0) goto switchD_0011ff60_default;
      cm_archive_error_string_abi_cxx11_(&archiveFilterName,this->Archive);
      cmStrCat<char_const(&)[34],std::__cxx11::string>
                (&source_date_epoch,(char (*) [34])"archive_compressor_zstd_options: ",
                 &archiveFilterName);
    }
    else {
      cm_archive_error_string_abi_cxx11_(&archiveFilterName,this->Archive);
      cmStrCat<char_const(&)[32],std::__cxx11::string>
                (&source_date_epoch,(char (*) [32])"archive_write_add_filter_zstd: ",
                 &archiveFilterName);
    }
    break;
  default:
switchD_0011ff60_default:
    if (compressionLevel != 0) {
      std::__cxx11::to_string(&source_date_epoch,compressionLevel);
      archiveFilterName._M_dataplus._M_p = (pointer)&archiveFilterName.field_2;
      archiveFilterName._M_string_length = 0;
      archiveFilterName.field_2._M_local_buf[0] = '\0';
      if (((c - CompressGZip < 5) &&
          (std::__cxx11::string::assign((char *)&archiveFilterName),
          archiveFilterName._M_string_length != 0)) &&
         (iVar2 = archive_write_set_filter_option
                            (this->Archive,archiveFilterName._M_dataplus._M_p,"compression-level",
                             source_date_epoch._M_dataplus._M_p), iVar2 != 0)) {
        cm_archive_error_string_abi_cxx11_(&local_50,this->Archive);
        cmStrCat<char_const(&)[34],std::__cxx11::string>
                  (&local_90,(char (*) [34])"archive_write_set_filter_option: ",&local_50);
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_50);
        goto LAB_001202c3;
      }
      std::__cxx11::string::~string((string *)&archiveFilterName);
      std::__cxx11::string::~string((string *)&source_date_epoch);
    }
    iVar2 = archive_read_disk_set_standard_lookup(this->Disk);
    if (iVar2 == 0) {
      iVar2 = archive_write_set_format_by_name(this->Archive,(format->_M_dataplus)._M_p);
      if (iVar2 == 0) {
        iVar2 = archive_write_set_bytes_in_last_block(this->Archive,1);
        if (iVar2 == 0) goto LAB_00120396;
        cm_archive_error_string_abi_cxx11_(&archiveFilterName,this->Archive);
        cmStrCat<char_const(&)[40],std::__cxx11::string>
                  (&source_date_epoch,(char (*) [40])"archive_write_set_bytes_in_last_block: ",
                   &archiveFilterName);
      }
      else {
        cm_archive_error_string_abi_cxx11_(&archiveFilterName,this->Archive);
        cmStrCat<char_const(&)[35],std::__cxx11::string>
                  (&source_date_epoch,(char (*) [35])"archive_write_set_format_by_name: ",
                   &archiveFilterName);
      }
    }
    else {
      cm_archive_error_string_abi_cxx11_(&archiveFilterName,this->Archive);
      cmStrCat<char_const(&)[40],std::__cxx11::string>
                (&source_date_epoch,(char (*) [40])"archive_read_disk_set_standard_lookup: ",
                 &archiveFilterName);
    }
  }
  std::__cxx11::string::operator=((string *)this_00,(string *)&source_date_epoch);
  std::__cxx11::string::~string((string *)&source_date_epoch);
LAB_00120391:
  std::__cxx11::string::~string((string *)this_02);
LAB_00120396:
  std::__cxx11::string::~string((string *)&sNumThreads);
  return;
}

Assistant:

cmArchiveWrite::cmArchiveWrite(std::ostream& os, Compress c,
                               std::string const& format, int compressionLevel,
                               int numThreads)
  : Stream(os)
  , Archive(archive_write_new())
  , Disk(archive_read_disk_new())
  , Format(format)
{
  // Upstream fixed an issue with their integer parsing in 3.4.0
  // which would cause spurious errors to be raised from `strtoull`.

  if (numThreads < 1) {
    int upperLimit = (numThreads == 0) ? std::numeric_limits<int>::max()
                                       : std::abs(numThreads);

    numThreads =
      cm::clamp<int>(std::thread::hardware_concurrency(), 1, upperLimit);
  }

  std::string sNumThreads = std::to_string(numThreads);

  switch (c) {
    case CompressNone:
      if (archive_write_add_filter_none(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_none: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      break;
    case CompressCompress:
      if (archive_write_add_filter_compress(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_compress: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      break;
    case CompressGZip: {
      if (archive_write_add_filter_gzip(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_gzip: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      std::string source_date_epoch;
      cmSystemTools::GetEnv("SOURCE_DATE_EPOCH", source_date_epoch);
      if (!source_date_epoch.empty()) {
        // We're not able to specify an arbitrary timestamp for gzip.
        // The next best thing is to omit the timestamp entirely.
        if (archive_write_set_filter_option(this->Archive, "gzip", "timestamp",
                                            nullptr) != ARCHIVE_OK) {
          this->Error = cmStrCat("archive_write_set_filter_option: ",
                                 cm_archive_error_string(this->Archive));
          return;
        }
      }
    } break;
    case CompressBZip2:
      if (archive_write_add_filter_bzip2(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_bzip2: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      break;
    case CompressLZMA:
      if (archive_write_add_filter_lzma(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_lzma: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      break;
    case CompressXZ:
      if (archive_write_add_filter_xz(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_xz: ",
                               cm_archive_error_string(this->Archive));
        return;
      }

#if ARCHIVE_VERSION_NUMBER >= 3004000

#  ifdef _AIX
      // FIXME: Using more than 2 threads creates an empty archive.
      // Enforce this limit pending further investigation.
      if (numThreads > 2) {
        numThreads = 2;
        sNumThreads = std::to_string(numThreads);
      }
#  endif
      if (archive_write_set_filter_option(this->Archive, "xz", "threads",
                                          sNumThreads.c_str()) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_compressor_xz_options: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
#endif

      break;
    case CompressZstd:
      if (archive_write_add_filter_zstd(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_zstd: ",
                               cm_archive_error_string(this->Archive));
        return;
      }

#if ARCHIVE_VERSION_NUMBER >= 3006000
      if (archive_write_set_filter_option(this->Archive, "zstd", "threads",
                                          sNumThreads.c_str()) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_compressor_zstd_options: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
#endif
      break;
  }

  if (compressionLevel != 0) {
    std::string compressionLevelStr = std::to_string(compressionLevel);
    std::string archiveFilterName;
    switch (c) {
      case CompressNone:
      case CompressCompress:
        break;
      case CompressGZip:
        archiveFilterName = "gzip";
        break;
      case CompressBZip2:
        archiveFilterName = "bzip2";
        break;
      case CompressLZMA:
        archiveFilterName = "lzma";
        break;
      case CompressXZ:
        archiveFilterName = "xz";
        break;
      case CompressZstd:
        archiveFilterName = "zstd";
        break;
    }
    if (!archiveFilterName.empty()) {
      if (archive_write_set_filter_option(
            this->Archive, archiveFilterName.c_str(), "compression-level",
            compressionLevelStr.c_str()) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_set_filter_option: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
    }
  }

#if !defined(_WIN32) || defined(__CYGWIN__)
  if (archive_read_disk_set_standard_lookup(this->Disk) != ARCHIVE_OK) {
    this->Error = cmStrCat("archive_read_disk_set_standard_lookup: ",
                           cm_archive_error_string(this->Archive));
    return;
  }
#endif

  if (archive_write_set_format_by_name(this->Archive, format.c_str()) !=
      ARCHIVE_OK) {
    this->Error = cmStrCat("archive_write_set_format_by_name: ",
                           cm_archive_error_string(this->Archive));
    return;
  }

  // do not pad the last block!!
  if (archive_write_set_bytes_in_last_block(this->Archive, 1)) {
    this->Error = cmStrCat("archive_write_set_bytes_in_last_block: ",
                           cm_archive_error_string(this->Archive));
    return;
  }
}